

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O1

void fs_print_error(string_view path1,string_view path2,string_view fname,error_code *ec)

{
  ostream *poVar1;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"ERROR: Ffilesystem:",0x13);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,fname._M_str,fname._M_len);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"(",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,path1._M_str,path1._M_len);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,path2._M_str,path2._M_len);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")  ",3);
  if (ec->_M_value != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"C++ exception:",0xe);
    (**(code **)(*(long *)ec->_M_cat + 0x20))(&local_50,ec->_M_cat,ec->_M_value);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)local_50,local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,ec->_M_value);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
  }
  fs_emit_error();
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
  return;
}

Assistant:

void fs_print_error(std::string_view path1, std::string_view path2, std::string_view fname, const std::error_code& ec)
{
  std::cerr << "ERROR: Ffilesystem:" << fname << "(" << path1 <<  ", " << path2 << ")  ";

  if(ec)
    std::cerr << "C++ exception:" << ec.message() <<  " " << ec.value() << " ";

  fs_emit_error();

  std::cerr << std::endl;
}